

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O1

void setpath(lua_State *L,char *fieldname,char *envname,char *dft)

{
  int iVar1;
  char *pcVar2;
  
  pcVar2 = lua_pushfstring(L,"%s%s",envname,"_5_3");
  pcVar2 = getenv(pcVar2);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = getenv(envname);
  }
  if (pcVar2 != (char *)0x0) {
    lua_getfield(L,-0xf4628,"LUA_NOENV");
    iVar1 = lua_toboolean(L,-1);
    lua_settop(L,-2);
    if (iVar1 == 0) {
      pcVar2 = luaL_gsub(L,pcVar2,";;",";\x01;");
      luaL_gsub(L,pcVar2,"\x01",dft);
      lua_rotate(L,-2,-1);
      lua_settop(L,-2);
      goto LAB_00110ccb;
    }
  }
  lua_pushstring(L,dft);
LAB_00110ccb:
  lua_setfield(L,-3,fieldname);
  lua_settop(L,-2);
  return;
}

Assistant:

static void setpath(lua_State *L, const char *fieldname,
                    const char *envname,
                    const char *dft) {
    const char *nver = lua_pushfstring(L, "%s%s", envname, LUA_VERSUFFIX);
    const char *path = getenv(nver);  /* use versioned name */
    if (path == NULL)  /* no environment variable? */
        path = getenv(envname);  /* try unversioned name */
    if (path == NULL || noenv(L))  /* no environment variable? */
        lua_pushstring(L, dft);  /* use default */
    else {
        /* replace ";;" by ";AUXMARK;" and then AUXMARK by default path */
        path = luaL_gsub(L, path, LUA_PATH_SEP LUA_PATH_SEP,
                         LUA_PATH_SEP AUXMARK LUA_PATH_SEP);
        luaL_gsub(L, path, AUXMARK, dft);
        lua_remove(L, -2); /* remove result from 1st 'gsub' */
    }
    setprogdir(L);
    lua_setfield(L, -3, fieldname);  /* package[fieldname] = path value */
    lua_pop(L, 1);  /* pop versioned variable name */
}